

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_handler_TURN_LIVING(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  project_monster_handler_context_t *context_local;
  
  if ((context->seen & 1U) != 0) {
    flag_on_dbg(context->lore->flags,0xc,0x4a,"context->lore->flags","RF_NONLIVING");
    flag_on_dbg(context->lore->flags,0xc,0x49,"context->lore->flags","RF_UNDEAD");
  }
  _Var1 = monster_is_living(context->mon);
  if (_Var1) {
    wVar2 = adjust_radius(context,context->dam);
    context->mon_timed[3] = wVar2;
    if ((context->seen & 1U) != 0) {
      context->obvious = true;
    }
  }
  else {
    context->skipped = true;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_TURN_LIVING(project_monster_handler_context_t *context)
{
	if (context->seen) {
		rf_on(context->lore->flags, RF_NONLIVING);
		rf_on(context->lore->flags, RF_UNDEAD);
	}

	if (monster_is_living(context->mon)) {
		context->mon_timed[MON_TMD_FEAR] =
			adjust_radius(context, context->dam);
		if (context->seen) context->obvious = true;
	} else {
		context->skipped = true;
	}

	context->dam = 0;
}